

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  int iVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  FILE *__stream;
  ulong sonum;
  size_t __size;
  uchar *puVar4;
  size_t sVar5;
  char *__haystack;
  char *__haystack_00;
  size_t sVar6;
  uchar *__s2;
  char *encoded;
  uchar *pem_ptr;
  size_t encodedlen;
  char *local_50;
  uchar *local_48;
  size_t local_40;
  char *local_38;
  
  local_48 = (uchar *)0x0;
  if (pinnedpubkey == (char *)0x0) {
    return CURLE_OK;
  }
  if (pubkeylen == 0 || pubkey == (uchar *)0x0) {
    return CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  iVar1 = strncmp(pinnedpubkey,"sha256//",8);
  if (iVar1 == 0) {
    if (Curl_ssl->sha256sum == (_func_CURLcode_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
      return CURLE_SSL_PINNEDPUBKEYNOTMATCH;
    }
    puVar4 = (uchar *)(*Curl_cmalloc)(0x20);
    if (puVar4 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = (*Curl_ssl->sha256sum)(pubkey,pubkeylen,puVar4,0x20);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    CVar2 = Curl_base64_encode(data,(char *)puVar4,0x20,&local_50,&local_40);
    (*Curl_cfree)(puVar4);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    Curl_infof(data,"\t public key hash: sha256//%s\n",local_50);
    sVar5 = strlen(pinnedpubkey);
    __haystack = (char *)(*Curl_cmalloc)(sVar5 + 1);
    if (__haystack == (char *)0x0) {
      (*Curl_cfree)(local_50);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(__haystack,pinnedpubkey,sVar5 + 1);
    local_38 = __haystack;
    while( true ) {
      __haystack_00 = strstr(__haystack,";sha256//");
      sVar5 = local_40;
      if (__haystack_00 != (char *)0x0) {
        *__haystack_00 = '\0';
      }
      sVar6 = strlen(__haystack + 8);
      if ((sVar5 == sVar6) && (iVar1 = bcmp(local_50,__haystack + 8,sVar5), iVar1 == 0)) break;
      if (__haystack_00 != (char *)0x0) {
        *__haystack_00 = ';';
        __haystack = strstr(__haystack_00,"sha256//");
      }
      CVar2 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
      if ((__haystack_00 == (char *)0x0) || (__haystack == (char *)0x0)) goto LAB_0014f096;
    }
    CVar2 = CURLE_OK;
LAB_0014f096:
    (*Curl_cfree)(local_50);
    local_50 = (char *)0x0;
    (*Curl_cfree)(local_38);
    return CVar2;
  }
  __stream = fopen64(pinnedpubkey,"rb");
  if (__stream == (FILE *)0x0) {
    return CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  puVar4 = (uchar *)0x0;
  iVar1 = fseek(__stream,0,2);
  CVar2 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (iVar1 == 0) {
    sonum = ftell(__stream);
    puVar4 = (uchar *)0x0;
    iVar1 = fseek(__stream,0,0);
    if ((sonum < 0x100001) && (iVar1 == 0)) {
      __size = curlx_sotouz(sonum);
      if ((__size < pubkeylen) ||
         (puVar4 = (uchar *)(*Curl_cmalloc)(__size + 1), puVar4 == (uchar *)0x0)) {
        puVar4 = (uchar *)0x0;
      }
      else {
        sVar5 = fread(puVar4,__size,1,__stream);
        if ((int)sVar5 == 1) {
          __s2 = puVar4;
          if (__size != pubkeylen) {
            puVar4[__size] = '\0';
            CVar3 = pubkey_pem_to_der((char *)puVar4,&local_48,&local_40);
            if ((CVar3 != CURLE_OK) || (__s2 = local_48, local_40 != pubkeylen)) goto LAB_0014ee02;
          }
          iVar1 = bcmp(pubkey,__s2,pubkeylen);
          CVar2 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          if (iVar1 == 0) {
            CVar2 = CURLE_OK;
          }
        }
      }
    }
  }
LAB_0014ee02:
  (*Curl_cfree)(puVar4);
  (*Curl_cfree)(local_48);
  local_48 = (uchar *)0x0;
  fclose(__stream);
  return CVar2;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  FILE *fp;
  unsigned char *buf = NULL, *pem_ptr = NULL;
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;

  /* if a path wasn't specified, don't pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(strncmp(pinnedpubkey, "sha256//", 8) == 0) {
    CURLcode encode;
    size_t encodedlen, pinkeylen;
    char *encoded, *pinkeycopy, *begin_pos, *end_pos;
    unsigned char *sha256sumdigest;

    if(!Curl_ssl->sha256sum) {
      /* without sha256 support, this cannot match */
      return result;
    }

    /* compute sha256sum of public key */
    sha256sumdigest = malloc(CURL_SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    encode = Curl_ssl->sha256sum(pubkey, pubkeylen,
                        sha256sumdigest, CURL_SHA256_DIGEST_LENGTH);

    if(encode != CURLE_OK)
      return encode;

    encode = Curl_base64_encode(data, (char *)sha256sumdigest,
                                CURL_SHA256_DIGEST_LENGTH, &encoded,
                                &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, "\t public key hash: sha256//%s\n", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeylen = strlen(pinnedpubkey) + 1;
    pinkeycopy = malloc(pinkeylen);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pinkeycopy, pinnedpubkey, pinkeylen);
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it'll go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
    return result;
  }

  fp = fopen(pinnedpubkey, "rb");
  if(!fp)
    return result;

  do {
    long filesize;
    size_t size, pem_len;
    CURLcode pem_read;

    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      break;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      break;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      break;

    /*
     * if the size of our certificate is bigger than the file
     * size then it can't match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      break;

    /*
     * Allocate buffer for the pinned key
     * With 1 additional byte for null terminator in case of PEM key
     */
    buf = malloc(size + 1);
    if(!buf)
      break;

    /* Returns number of elements read, which should be 1 */
    if((int) fread(buf, size, 1, fp) != 1)
      break;

    /* If the sizes are the same, it can't be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, buf, pubkeylen))
        result = CURLE_OK;
      break;
    }

    /*
     * Otherwise we will assume it's PEM and try to decode it
     * after placing null terminator
     */
    buf[size] = '\0';
    pem_read = pubkey_pem_to_der((const char *)buf, &pem_ptr, &pem_len);
    /* if it wasn't read successfully, exit */
    if(pem_read)
      break;

    /*
     * if the size of our certificate doesn't match the size of
     * the decoded file, they can't be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
  } while(0);

  Curl_safefree(buf);
  Curl_safefree(pem_ptr);
  fclose(fp);

  return result;
}